

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O0

FT_Error pcf_get_bdf_property(PCF_Face face,char *prop_name,BDF_PropertyRec *aproperty)

{
  PCF_Property pPVar1;
  PCF_Property prop;
  BDF_PropertyRec *aproperty_local;
  char *prop_name_local;
  PCF_Face face_local;
  
  pPVar1 = pcf_find_property(face,prop_name);
  if (pPVar1 == (PCF_Property)0x0) {
    face_local._4_4_ = 6;
  }
  else {
    if (pPVar1->isString == '\0') {
      aproperty->type = BDF_PROPERTY_TYPE_INTEGER;
      (aproperty->u).integer = (FT_Int32)(pPVar1->value).l;
    }
    else {
      aproperty->type = BDF_PROPERTY_TYPE_ATOM;
      aproperty->u = *(anon_union_8_3_4cd875ef_for_u *)&pPVar1->value;
    }
    face_local._4_4_ = 0;
  }
  return face_local._4_4_;
}

Assistant:

static FT_Error
  pcf_get_bdf_property( PCF_Face          face,
                        const char*       prop_name,
                        BDF_PropertyRec  *aproperty )
  {
    PCF_Property  prop;


    prop = pcf_find_property( face, prop_name );
    if ( prop )
    {
      if ( prop->isString )
      {
        aproperty->type   = BDF_PROPERTY_TYPE_ATOM;
        aproperty->u.atom = prop->value.atom;
      }
      else
      {
        if ( prop->value.l > 0x7FFFFFFFL          ||
             prop->value.l < ( -1 - 0x7FFFFFFFL ) )
        {
          FT_TRACE2(( "pcf_get_bdf_property:"
                      " too large integer 0x%lx is truncated\n",
                      prop->value.l ));
        }

        /*
         * The PCF driver loads all properties as signed integers.
         * This really doesn't seem to be a problem, because this is
         * sufficient for any meaningful values.
         */
        aproperty->type      = BDF_PROPERTY_TYPE_INTEGER;
        aproperty->u.integer = (FT_Int32)prop->value.l;
      }

      return FT_Err_Ok;
    }

    return FT_THROW( Invalid_Argument );
  }